

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void jmp_append(FuncState *fs,BCPos *l1,BCPos l2)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  BCPos BVar4;
  
  if (l2 != 0xffffffff) {
    if (*l1 == 0xffffffff) {
      *l1 = l2;
    }
    else {
      BVar4 = *l1;
      do {
        uVar3 = BVar4;
        lVar2 = (ulong)*(ushort *)((long)&fs->bcbase[uVar3].ins + 2) - 0x8000;
        if (lVar2 == -1) break;
        BVar4 = uVar3 + (int)lVar2 + 1;
      } while (BVar4 != 0xffffffff);
      uVar1 = (l2 - uVar3) + 0x7fff;
      if (0xffff < uVar1) {
        err_syntax(fs->ls,LJ_ERR_XJUMP);
      }
      *(short *)((long)&fs->bcbase[uVar3].ins + 2) = (short)uVar1;
    }
  }
  return;
}

Assistant:

static void jmp_append(FuncState *fs, BCPos *l1, BCPos l2)
{
  if (l2 == NO_JMP) {
    return;
  } else if (*l1 == NO_JMP) {
    *l1 = l2;
  } else {
    BCPos list = *l1;
    BCPos next;
    while ((next = jmp_next(fs, list)) != NO_JMP)  /* Find last element. */
      list = next;
    jmp_patchins(fs, list, l2);
  }
}